

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

xmlSchemaTypePtr
xmlSchemaParseSimpleType
          (xmlSchemaParserCtxtPtr ctxt,xmlSchemaPtr schema,xmlNodePtr node,int topLevel)

{
  bool bVar1;
  xmlSchemaPtr ctxt_00;
  int iVar2;
  xmlAttrPtr attr_00;
  xmlSchemaTypePtr pxVar3;
  xmlNodePtr node_00;
  xmlSchemaAnnotPtr pxVar4;
  xmlSchemaTypePtr biType;
  xmlAttrPtr pxStack_58;
  int hasRestriction;
  xmlAttrPtr attr;
  xmlChar *attrValue;
  xmlNodePtr child;
  xmlSchemaTypePtr oldCtxtType;
  xmlSchemaTypePtr type;
  xmlNodePtr pxStack_28;
  int topLevel_local;
  xmlNodePtr node_local;
  xmlSchemaPtr schema_local;
  xmlSchemaParserCtxtPtr ctxt_local;
  
  attrValue = (xmlChar *)0x0;
  attr = (xmlAttrPtr)0x0;
  bVar1 = false;
  if (((ctxt == (xmlSchemaParserCtxtPtr)0x0) || (schema == (xmlSchemaPtr)0x0)) ||
     (node == (xmlNodePtr)0x0)) {
    return (xmlSchemaTypePtr)0x0;
  }
  type._4_4_ = topLevel;
  pxStack_28 = node;
  node_local = (xmlNodePtr)schema;
  schema_local = (xmlSchemaPtr)ctxt;
  if (topLevel != 0) {
    attr_00 = xmlSchemaGetPropNode(node,"name");
    ctxt_00 = schema_local;
    if (attr_00 == (xmlAttrPtr)0x0) {
      xmlSchemaPMissingAttrErr
                ((xmlSchemaParserCtxtPtr)schema_local,XML_SCHEMAP_S4S_ATTR_MISSING,
                 (xmlSchemaBasicItemPtr)0x0,pxStack_28,"name",(char *)0x0);
      return (xmlSchemaTypePtr)0x0;
    }
    pxVar3 = xmlSchemaGetBuiltInType(XML_SCHEMAS_NCNAME);
    iVar2 = xmlSchemaPValAttrNode
                      ((xmlSchemaParserCtxtPtr)ctxt_00,(xmlSchemaBasicItemPtr)0x0,attr_00,pxVar3,
                       (xmlChar **)&attr);
    if (iVar2 != 0) {
      return (xmlSchemaTypePtr)0x0;
    }
    if (*(int *)&schema_local[1].id != 0) {
      if (*(int *)((long)&schema_local[1].id + 4) != 0) {
        xmlSchemaPCustomErr((xmlSchemaParserCtxtPtr)schema_local,XML_SCHEMAP_SRC_REDEFINE,
                            (xmlSchemaBasicItemPtr)0x0,pxStack_28,
                            "Redefinition of built-in simple types is not supported",(xmlChar *)0x0)
        ;
        return (xmlSchemaTypePtr)0x0;
      }
      pxVar3 = xmlSchemaGetPredefinedType((xmlChar *)attr,xmlSchemaNs);
      if (pxVar3 != (xmlSchemaTypePtr)0x0) {
        return pxVar3;
      }
    }
  }
  if (type._4_4_ == 0) {
    oldCtxtType = xmlSchemaAddType((xmlSchemaParserCtxtPtr)schema_local,(xmlSchemaPtr)node_local,
                                   XML_SCHEMA_TYPE_SIMPLE,(xmlChar *)0x0,
                                   (xmlChar *)schema_local[1].annot,pxStack_28,0);
    if (oldCtxtType == (xmlSchemaTypePtr)0x0) {
      return (xmlSchemaTypePtr)0x0;
    }
    oldCtxtType->type = XML_SCHEMA_TYPE_SIMPLE;
    oldCtxtType->contentType = XML_SCHEMA_CONTENT_SIMPLE;
    for (pxStack_58 = pxStack_28->properties; pxStack_58 != (xmlAttrPtr)0x0;
        pxStack_58 = pxStack_58->next) {
      if (pxStack_58->ns == (xmlNs *)0x0) {
        iVar2 = xmlStrEqual(pxStack_58->name,"id");
        if (iVar2 == 0) {
          xmlSchemaPIllegalAttrErr
                    ((xmlSchemaParserCtxtPtr)schema_local,XML_SCHEMAP_S4S_ATTR_NOT_ALLOWED,
                     (xmlSchemaBasicItemPtr)0x0,pxStack_58);
        }
      }
      else {
        iVar2 = xmlStrEqual(pxStack_58->ns->href,xmlSchemaNs);
        if (iVar2 != 0) {
          xmlSchemaPIllegalAttrErr
                    ((xmlSchemaParserCtxtPtr)schema_local,XML_SCHEMAP_S4S_ATTR_NOT_ALLOWED,
                     (xmlSchemaBasicItemPtr)0x0,pxStack_58);
        }
      }
    }
  }
  else {
    oldCtxtType = xmlSchemaAddType((xmlSchemaParserCtxtPtr)schema_local,(xmlSchemaPtr)node_local,
                                   XML_SCHEMA_TYPE_SIMPLE,(xmlChar *)attr,
                                   (xmlChar *)schema_local[1].annot,pxStack_28,1);
    if (oldCtxtType == (xmlSchemaTypePtr)0x0) {
      return (xmlSchemaTypePtr)0x0;
    }
    oldCtxtType->type = XML_SCHEMA_TYPE_SIMPLE;
    oldCtxtType->contentType = XML_SCHEMA_CONTENT_SIMPLE;
    oldCtxtType->flags = oldCtxtType->flags | 8;
    for (pxStack_58 = pxStack_28->properties; pxStack_58 != (xmlAttrPtr)0x0;
        pxStack_58 = pxStack_58->next) {
      if (pxStack_58->ns == (xmlNs *)0x0) {
        iVar2 = xmlStrEqual(pxStack_58->name,"id");
        if (((iVar2 == 0) && (iVar2 = xmlStrEqual(pxStack_58->name,"name"), iVar2 == 0)) &&
           (iVar2 = xmlStrEqual(pxStack_58->name,(xmlChar *)"final"), iVar2 == 0)) {
          xmlSchemaPIllegalAttrErr
                    ((xmlSchemaParserCtxtPtr)schema_local,XML_SCHEMAP_S4S_ATTR_NOT_ALLOWED,
                     (xmlSchemaBasicItemPtr)0x0,pxStack_58);
        }
      }
      else {
        iVar2 = xmlStrEqual(pxStack_58->ns->href,xmlSchemaNs);
        if (iVar2 != 0) {
          xmlSchemaPIllegalAttrErr
                    ((xmlSchemaParserCtxtPtr)schema_local,XML_SCHEMAP_S4S_ATTR_NOT_ALLOWED,
                     (xmlSchemaBasicItemPtr)0x0,pxStack_58);
        }
      }
    }
    node_00 = (xmlNodePtr)xmlSchemaGetPropNode(pxStack_28,"final");
    if (node_00 == (xmlNodePtr)0x0) {
      if (((ulong)node_local->next & 8) != 0) {
        oldCtxtType->flags = oldCtxtType->flags | 0x400;
      }
      if (((ulong)node_local->next & 0x10) != 0) {
        oldCtxtType->flags = oldCtxtType->flags | 0x800;
      }
      if (((ulong)node_local->next & 0x20) != 0) {
        oldCtxtType->flags = oldCtxtType->flags | 0x1000;
      }
    }
    else {
      attr = (xmlAttrPtr)xmlSchemaGetProp((xmlSchemaParserCtxtPtr)schema_local,pxStack_28,"final");
      iVar2 = xmlSchemaPValAttrBlockFinal
                        ((xmlChar *)attr,&oldCtxtType->flags,-1,-1,0x400,-1,0x800,0x1000);
      if (iVar2 != 0) {
        xmlSchemaPSimpleTypeErr
                  ((xmlSchemaParserCtxtPtr)schema_local,XML_SCHEMAP_S4S_ATTR_INVALID_VALUE,
                   (xmlSchemaBasicItemPtr)oldCtxtType,node_00,(xmlSchemaTypePtr)0x0,
                   "(#all | List of (list | union | restriction)",(xmlChar *)attr,(char *)0x0,
                   (xmlChar *)0x0,(xmlChar *)0x0);
      }
    }
  }
  oldCtxtType->targetNamespace = (xmlChar *)schema_local[1].annot;
  xmlSchemaPValAttrID((xmlSchemaParserCtxtPtr)schema_local,pxStack_28,"id");
  child = (xmlNodePtr)schema_local[1].name;
  schema_local[1].name = (xmlChar *)oldCtxtType;
  attrValue = (xmlChar *)pxStack_28->children;
  if ((((_xmlNode *)attrValue != (_xmlNode *)0x0) && (((_xmlNode *)attrValue)->ns != (xmlNs *)0x0))
     && ((iVar2 = xmlStrEqual(((_xmlNode *)attrValue)->name,(xmlChar *)"annotation"), iVar2 != 0 &&
         (iVar2 = xmlStrEqual(*(xmlChar **)(*(long *)(attrValue + 0x48) + 0x10),xmlSchemaNs),
         iVar2 != 0)))) {
    pxVar4 = xmlSchemaParseAnnotation((xmlSchemaParserCtxtPtr)schema_local,(xmlNodePtr)attrValue,1);
    oldCtxtType->annot = pxVar4;
    attrValue = *(xmlChar **)(attrValue + 0x30);
  }
  if (attrValue == (xmlChar *)0x0) {
    xmlSchemaPContentErr
              ((xmlSchemaParserCtxtPtr)schema_local,XML_SCHEMAP_S4S_ELEM_MISSING,
               (xmlSchemaBasicItemPtr)0x0,pxStack_28,(xmlNodePtr)0x0,(char *)0x0,
               "(annotation?, (restriction | list | union))");
  }
  else if ((((attrValue == (xmlChar *)0x0) || (*(long *)(attrValue + 0x48) == 0)) ||
           (iVar2 = xmlStrEqual(*(xmlChar **)(attrValue + 0x10),(xmlChar *)"restriction"),
           iVar2 == 0)) ||
          (iVar2 = xmlStrEqual(*(xmlChar **)(*(long *)(attrValue + 0x48) + 0x10),xmlSchemaNs),
          iVar2 == 0)) {
    if (((attrValue == (xmlChar *)0x0) || (*(long *)(attrValue + 0x48) == 0)) ||
       ((iVar2 = xmlStrEqual(*(xmlChar **)(attrValue + 0x10),"list"), iVar2 == 0 ||
        (iVar2 = xmlStrEqual(*(xmlChar **)(*(long *)(attrValue + 0x48) + 0x10),xmlSchemaNs),
        iVar2 == 0)))) {
      if ((((attrValue != (xmlChar *)0x0) && (*(long *)(attrValue + 0x48) != 0)) &&
          (iVar2 = xmlStrEqual(*(xmlChar **)(attrValue + 0x10),"union"), iVar2 != 0)) &&
         (iVar2 = xmlStrEqual(*(xmlChar **)(*(long *)(attrValue + 0x48) + 0x10),xmlSchemaNs),
         iVar2 != 0)) {
        xmlSchemaParseUnion((xmlSchemaParserCtxtPtr)schema_local,(xmlSchemaPtr)node_local,
                            (xmlNodePtr)attrValue);
        attrValue = *(xmlChar **)(attrValue + 0x30);
      }
    }
    else {
      xmlSchemaParseList((xmlSchemaParserCtxtPtr)schema_local,(xmlSchemaPtr)node_local,
                         (xmlNodePtr)attrValue);
      attrValue = *(xmlChar **)(attrValue + 0x30);
    }
  }
  else {
    xmlSchemaParseRestriction
              ((xmlSchemaParserCtxtPtr)schema_local,(xmlSchemaPtr)node_local,(xmlNodePtr)attrValue,
               XML_SCHEMA_TYPE_SIMPLE);
    bVar1 = true;
    attrValue = *(xmlChar **)(attrValue + 0x30);
  }
  if (attrValue != (xmlChar *)0x0) {
    xmlSchemaPContentErr
              ((xmlSchemaParserCtxtPtr)schema_local,XML_SCHEMAP_S4S_ELEM_NOT_ALLOWED,
               (xmlSchemaBasicItemPtr)0x0,pxStack_28,(xmlNodePtr)attrValue,(char *)0x0,
               "(annotation?, (restriction | list | union))");
  }
  if (((type._4_4_ != 0) && (*(int *)((long)&schema_local[1].id + 4) != 0)) && (!bVar1)) {
    xmlSchemaPCustomErr((xmlSchemaParserCtxtPtr)schema_local,XML_SCHEMAP_SRC_REDEFINE,
                        (xmlSchemaBasicItemPtr)0x0,pxStack_28,
                        "This is a redefinition, thus the <simpleType> must have a <restriction> child"
                        ,(xmlChar *)0x0);
  }
  schema_local[1].name = (xmlChar *)child;
  return oldCtxtType;
}

Assistant:

static xmlSchemaTypePtr
xmlSchemaParseSimpleType(xmlSchemaParserCtxtPtr ctxt, xmlSchemaPtr schema,
                         xmlNodePtr node, int topLevel)
{
    xmlSchemaTypePtr type, oldCtxtType;
    xmlNodePtr child = NULL;
    const xmlChar *attrValue = NULL;
    xmlAttrPtr attr;
    int hasRestriction = 0;

    if ((ctxt == NULL) || (schema == NULL) || (node == NULL))
        return (NULL);

    if (topLevel) {
	attr = xmlSchemaGetPropNode(node, "name");
	if (attr == NULL) {
	    xmlSchemaPMissingAttrErr(ctxt,
		XML_SCHEMAP_S4S_ATTR_MISSING,
		NULL, node,
		"name", NULL);
	    return (NULL);
	} else {
	    if (xmlSchemaPValAttrNode(ctxt,
		NULL, attr,
		xmlSchemaGetBuiltInType(XML_SCHEMAS_NCNAME), &attrValue) != 0)
		return (NULL);
	    /*
	    * Skip built-in types.
	    */
	    if (ctxt->isS4S) {
		xmlSchemaTypePtr biType;

		if (ctxt->isRedefine) {
		    /*
		    * REDEFINE: Disallow redefinition of built-in-types.
		    * TODO: It seems that the spec does not say anything
		    * about this case.
		    */
		    xmlSchemaPCustomErr(ctxt, XML_SCHEMAP_SRC_REDEFINE,
			NULL, node,
			"Redefinition of built-in simple types is not "
			"supported", NULL);
		    return(NULL);
		}
		biType = xmlSchemaGetPredefinedType(attrValue, xmlSchemaNs);
		if (biType != NULL)
		    return (biType);
	    }
	}
    }
    /*
    * TargetNamespace:
    * SPEC "The `actual value` of the targetNamespace [attribute]
    * of the <schema> ancestor element information item if present,
    * otherwise `absent`.
    */
    if (topLevel == 0) {
#ifdef ENABLE_NAMED_LOCALS
        char buf[40];
#endif
	/*
	* Parse as local simple type definition.
	*/
#ifdef ENABLE_NAMED_LOCALS
        snprintf(buf, 39, "#ST%d", ctxt->counter++ + 1);
	type = xmlSchemaAddType(ctxt, schema,
	    XML_SCHEMA_TYPE_SIMPLE,
	    xmlDictLookup(ctxt->dict, (const xmlChar *)buf, -1),
	    ctxt->targetNamespace, node, 0);
#else
	type = xmlSchemaAddType(ctxt, schema,
	    XML_SCHEMA_TYPE_SIMPLE,
	    NULL, ctxt->targetNamespace, node, 0);
#endif
	if (type == NULL)
	    return (NULL);
	type->type = XML_SCHEMA_TYPE_SIMPLE;
	type->contentType = XML_SCHEMA_CONTENT_SIMPLE;
	/*
	* Check for illegal attributes.
	*/
	attr = node->properties;
	while (attr != NULL) {
	    if (attr->ns == NULL) {
		if (!xmlStrEqual(attr->name, BAD_CAST "id")) {
		    xmlSchemaPIllegalAttrErr(ctxt,
			XML_SCHEMAP_S4S_ATTR_NOT_ALLOWED, NULL, attr);
		}
	    } else if (xmlStrEqual(attr->ns->href, xmlSchemaNs)) {
		    xmlSchemaPIllegalAttrErr(ctxt,
			XML_SCHEMAP_S4S_ATTR_NOT_ALLOWED, NULL, attr);
	    }
	    attr = attr->next;
	}
    } else {
	/*
	* Parse as global simple type definition.
	*
	* Note that attrValue is the value of the attribute "name" here.
	*/
	type = xmlSchemaAddType(ctxt, schema, XML_SCHEMA_TYPE_SIMPLE,
	    attrValue, ctxt->targetNamespace, node, 1);
	if (type == NULL)
	    return (NULL);
	type->type = XML_SCHEMA_TYPE_SIMPLE;
	type->contentType = XML_SCHEMA_CONTENT_SIMPLE;
	type->flags |= XML_SCHEMAS_TYPE_GLOBAL;
	/*
	* Check for illegal attributes.
	*/
	attr = node->properties;
	while (attr != NULL) {
	    if (attr->ns == NULL) {
		if ((!xmlStrEqual(attr->name, BAD_CAST "id")) &&
		    (!xmlStrEqual(attr->name, BAD_CAST "name")) &&
		    (!xmlStrEqual(attr->name, BAD_CAST "final"))) {
		    xmlSchemaPIllegalAttrErr(ctxt,
			XML_SCHEMAP_S4S_ATTR_NOT_ALLOWED, NULL, attr);
		}
	    } else if (xmlStrEqual(attr->ns->href, xmlSchemaNs)) {
		xmlSchemaPIllegalAttrErr(ctxt,
		    XML_SCHEMAP_S4S_ATTR_NOT_ALLOWED, NULL, attr);
	    }
	    attr = attr->next;
	}
	/*
	* Attribute "final".
	*/
	attr = xmlSchemaGetPropNode(node, "final");
	if (attr == NULL) {
	    if (schema->flags & XML_SCHEMAS_FINAL_DEFAULT_RESTRICTION)
		type->flags |= XML_SCHEMAS_TYPE_FINAL_RESTRICTION;
	    if (schema->flags & XML_SCHEMAS_FINAL_DEFAULT_LIST)
		type->flags |= XML_SCHEMAS_TYPE_FINAL_LIST;
	    if (schema->flags & XML_SCHEMAS_FINAL_DEFAULT_UNION)
		type->flags |= XML_SCHEMAS_TYPE_FINAL_UNION;
	} else {
	    attrValue = xmlSchemaGetProp(ctxt, node, "final");
	    if (xmlSchemaPValAttrBlockFinal(attrValue, &(type->flags),
		-1, -1, XML_SCHEMAS_TYPE_FINAL_RESTRICTION, -1,
		XML_SCHEMAS_TYPE_FINAL_LIST,
		XML_SCHEMAS_TYPE_FINAL_UNION) != 0) {

		xmlSchemaPSimpleTypeErr(ctxt,
		    XML_SCHEMAP_S4S_ATTR_INVALID_VALUE,
		    WXS_BASIC_CAST type, (xmlNodePtr) attr,
		    NULL, "(#all | List of (list | union | restriction)",
		    attrValue, NULL, NULL, NULL);
	    }
	}
    }
    type->targetNamespace = ctxt->targetNamespace;
    xmlSchemaPValAttrID(ctxt, node, BAD_CAST "id");
    /*
    * And now for the children...
    */
    oldCtxtType = ctxt->ctxtType;

    ctxt->ctxtType = type;

    child = node->children;
    if (IS_SCHEMA(child, "annotation")) {
        type->annot = xmlSchemaParseAnnotation(ctxt, child, 1);
        child = child->next;
    }
    if (child == NULL) {
	xmlSchemaPContentErr(ctxt, XML_SCHEMAP_S4S_ELEM_MISSING,
	    NULL, node, child, NULL,
	    "(annotation?, (restriction | list | union))");
    } else if (IS_SCHEMA(child, "restriction")) {
        xmlSchemaParseRestriction(ctxt, schema, child,
	    XML_SCHEMA_TYPE_SIMPLE);
	hasRestriction = 1;
        child = child->next;
    } else if (IS_SCHEMA(child, "list")) {
        xmlSchemaParseList(ctxt, schema, child);
        child = child->next;
    } else if (IS_SCHEMA(child, "union")) {
        xmlSchemaParseUnion(ctxt, schema, child);
        child = child->next;
    }
    if (child != NULL) {
	xmlSchemaPContentErr(ctxt, XML_SCHEMAP_S4S_ELEM_NOT_ALLOWED,
	    NULL, node, child, NULL,
	    "(annotation?, (restriction | list | union))");
    }
    /*
    * REDEFINE: SPEC src-redefine (5)
    * "Within the [children], each <simpleType> must have a
    * <restriction> among its [children] ... the `actual value` of whose
    * base [attribute] must be the same as the `actual value` of its own
    * name attribute plus target namespace;"
    */
    if (topLevel && ctxt->isRedefine && (! hasRestriction)) {
	xmlSchemaPCustomErr(ctxt, XML_SCHEMAP_SRC_REDEFINE,
	    NULL, node, "This is a redefinition, thus the "
	    "<simpleType> must have a <restriction> child", NULL);
    }

    ctxt->ctxtType = oldCtxtType;
    return (type);
}